

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O2

int32_t uprv_copyEbcdic_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                          UErrorCode *pErrorCode)

{
  byte bVar1;
  ulong uVar2;
  int32_t iVar3;
  
  iVar3 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar3 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       (length != 0 && outData == (void *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      uVar2 = 0;
      for (iVar3 = length; 0 < iVar3; iVar3 = iVar3 + -1) {
        if (((ulong)*(byte *)((long)inData + uVar2) != 0) &&
           ((bVar1 = ""[*(byte *)((long)inData + uVar2)], bVar1 == 0 ||
            ((invariantChars[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0)))) {
          udata_printError_63(ds,
                              "uprv_copyEbcdic() string[%] contains a variant character in position %d\n"
                              ,(ulong)(uint)length,uVar2 & 0xffffffff);
          *pErrorCode = U_INVALID_CHAR_FOUND;
          return 0;
        }
        uVar2 = uVar2 + 1;
      }
      iVar3 = length;
      if (inData != outData && length != 0) {
        memcpy(outData,inData,(ulong)(uint)length);
      }
    }
  }
  return iVar3;
}

Assistant:

U_CFUNC int32_t
uprv_copyEbcdic(const UDataSwapper *ds,
                const void *inData, int32_t length, void *outData,
                UErrorCode *pErrorCode) {
    const uint8_t *s;
    uint8_t c;

    int32_t count;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and checking */
    s=(const uint8_t *)inData;
    count=length;
    while(count>0) {
        c=*s++;
        if(c!=0 && ((c=asciiFromEbcdic[c])==0 || !UCHAR_IS_INVARIANT(c))) {
            udata_printError(ds, "uprv_copyEbcdic() string[%] contains a variant character in position %d\n",
                             length, length-count);
            *pErrorCode=U_INVALID_CHAR_FOUND;
            return 0;
        }
        --count;
    }

    if(length>0 && inData!=outData) {
        uprv_memcpy(outData, inData, length);
    }

    return length;
}